

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenSorter(char *pFileName,int nVars)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (nVars < 2) {
    __assert_fail("nVars > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                  ,0x108,"void Abc_GenSorter(char *, int)");
  }
  __stream = fopen(pFileName,"w");
  pcVar3 = Extra_TimeStamp();
  fprintf(__stream,"# %d-bit sorter generated by ABC on %s\n",(ulong)(uint)nVars,pcVar3);
  fprintf(__stream,".model Sorter%02d\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,__stream);
  uVar7 = 0;
  do {
    fprintf(__stream," x%02d",uVar7);
    uVar5 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar5;
  } while (nVars != uVar5);
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  uVar5 = 0;
  do {
    fprintf(__stream," y%02d",(ulong)uVar5);
    uVar5 = uVar5 + 1;
  } while (nVars != uVar5);
  fputc(10,__stream);
  uVar5 = (nVars + -2) * nVars;
  if (1 < uVar5) {
    uVar6 = 0;
    uVar10 = uVar5 - 1;
    uVar5 = uVar6;
    if (uVar10 != 0) {
      do {
        uVar5 = uVar6 + 1;
        bVar1 = 9 < uVar10;
        uVar6 = uVar5;
        uVar10 = uVar10 / 10;
      } while (bVar1);
    }
  }
  if (nVars == 2) {
    fwrite(".subckt Comp a=x00 b=x01 x=y00 y=y01\n",0x25,1,__stream);
  }
  else {
    fwrite(".subckt Layer0",0xe,1,__stream);
    uVar6 = 1;
    if (1 < nVars) {
      uVar6 = nVars;
    }
    uVar7 = 0;
    do {
      fprintf(__stream," x%02d=x%02d",uVar7,uVar7);
      uVar10 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar10;
    } while (uVar6 != uVar10);
    uVar7 = 0;
    do {
      uVar10 = (int)uVar7 + 1;
      fprintf(__stream," y%02d=%0*d",uVar7,(ulong)uVar5,uVar7);
      uVar7 = (ulong)uVar10;
    } while (uVar6 != uVar10);
    fputc(10,__stream);
    uVar2 = nVars * 2 - 2;
    iVar8 = uVar10 - nVars;
    uVar10 = 2;
    if (2 < (int)uVar2) {
      uVar10 = uVar2;
    }
    uVar2 = 1;
    do {
      fprintf(__stream,".subckt Layer%d",(ulong)(uVar2 & 1));
      uVar4 = 0;
      do {
        fprintf(__stream," x%02d=%0*d",(ulong)uVar4,(ulong)uVar5,(ulong)(iVar8 + uVar4));
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
      iVar9 = iVar8 + uVar4;
      uVar7 = 0;
      do {
        iVar9 = iVar9 + 1;
        fprintf(__stream," y%02d=%0*d",uVar7,(ulong)uVar5);
        uVar4 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar4;
      } while (uVar6 != uVar4);
      fputc(10,__stream);
      uVar2 = uVar2 + 1;
      iVar8 = iVar9 - nVars;
    } while (uVar2 != uVar10);
    fprintf(__stream,".subckt Layer%d",(ulong)(uVar2 & 1));
    uVar2 = 0;
    uVar10 = iVar9 - nVars;
    do {
      fprintf(__stream," x%02d=%0*d",(ulong)uVar2,(ulong)uVar5,(ulong)uVar10);
      uVar2 = uVar2 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar2);
    uVar5 = 1;
    if (1 < nVars) {
      uVar5 = nVars;
    }
    uVar6 = 0;
    do {
      fprintf(__stream," y%02d=y%02d",(ulong)uVar6,(ulong)uVar6);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    fputc(10,__stream);
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  Abc_WriteLayer((FILE *)__stream,nVars,0);
  Abc_WriteLayer((FILE *)__stream,nVars,1);
  Abc_WriteComp((FILE *)__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenSorter( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigits;

    assert( nVars > 1 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %d-bit sorter generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model Sorter%02d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i );
    fprintf( pFile, "\n" );

    Counter = 0;
    nDigits = Abc_Base10Log( (nVars-2)*nVars );
    if ( nVars == 2 )
        fprintf( pFile, ".subckt Comp a=x00 b=x01 x=y00 y=y01\n" );
    else
    {
        fprintf( pFile, ".subckt Layer0" );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=x%02d", k, k );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
        fprintf( pFile, "\n" );
        Counter -= nVars;
        for ( i = 1; i < 2*nVars-2; i++ )
        {
            fprintf( pFile, ".subckt Layer%d", (i&1) );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
            fprintf( pFile, "\n" );
            Counter -= nVars;
        }
        fprintf( pFile, ".subckt Layer%d", (i&1) );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=y%02d", k, k );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );

    Abc_WriteLayer( pFile, nVars, 0 );
    Abc_WriteLayer( pFile, nVars, 1 );
    Abc_WriteComp( pFile );
    fclose( pFile );
}